

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

int amqp_simple_wait_method
              (amqp_connection_state_t state,amqp_channel_t expected_channel,
              amqp_method_number_t expected_method,amqp_method_t *output)

{
  int iVar1;
  amqp_frame_t frame;
  amqp_frame_t local_50;
  
  iVar1 = amqp_simple_wait_frame_noblock(state,&local_50,(timeval *)0x0);
  if (iVar1 == 0) {
    if (((local_50.channel == expected_channel) && (local_50.frame_type == '\x01')) &&
       (local_50.payload.method.id == expected_method)) {
      *(ulong *)output =
           CONCAT44(local_50.payload.body_fragment.len._4_4_,local_50.payload.method.id);
      output->decoded = local_50.payload.method.decoded;
      iVar1 = 0;
    }
    else {
      (*state->socket->klass->close)(state->socket);
      iVar1 = -0xc;
    }
  }
  return iVar1;
}

Assistant:

int amqp_simple_wait_method(amqp_connection_state_t state,
                            amqp_channel_t expected_channel,
                            amqp_method_number_t expected_method,
                            amqp_method_t *output)
{
  amqp_frame_t frame;
  int res = amqp_simple_wait_frame(state, &frame);
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  if (frame.channel != expected_channel
      || frame.frame_type != AMQP_FRAME_METHOD
      || frame.payload.method.id != expected_method) {
    amqp_socket_close(state->socket);
    return AMQP_STATUS_WRONG_METHOD;
  }
  *output = frame.payload.method;
  return AMQP_STATUS_OK;
}